

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::dump(Dictionary *this,ostream *out)

{
  entry_type eVar1;
  pointer peVar2;
  ostream *poVar3;
  char *pcVar4;
  entry *it;
  pointer peVar5;
  
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::endl<char,std::char_traits<char>>(poVar3);
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (peVar5 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_start; peVar5 != peVar2; peVar5 = peVar5 + 1) {
    eVar1 = peVar5->type;
    poVar3 = std::operator<<(out,(string *)peVar5);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = "word";
    if (eVar1 == label) {
      pcVar4 = "label";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void Dictionary::dump(std::ostream& out) const {
  out << words_.size() << std::endl;
  for (const auto& it : words_) {
    if (it.type == entry_type::label) {
        out << it.word << " " << it.count << " " << "label" << std::endl;
    } else {
        out << it.word << " " << it.count << " " << "word" << std::endl;
    }
  }
}